

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringPutcMethod::StringPutcMethod(StringPutcMethod *this,Compilation *comp)

{
  initializer_list<const_slang::ast::Type_*> __l;
  Type *returnType;
  allocator<const_slang::ast::Type_*> local_89;
  Type *local_88;
  Type *local_80;
  iterator local_78;
  size_type local_70;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  Compilation *local_18;
  Compilation *comp_local;
  StringPutcMethod *this_local;
  
  local_18 = comp;
  comp_local = (Compilation *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"putc",&local_39);
  local_88 = Compilation::getIntType(local_18);
  local_80 = Compilation::getByteType(local_18);
  local_78 = &local_88;
  local_70 = 2;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_89);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_68,__l,&local_89);
  returnType = Compilation::getVoidType(local_18);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,&local_38,Function,2,&local_68,returnType,true,true
            );
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_68);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__StringPutcMethod_00916f30;
  return;
}

Assistant:

explicit StringPutcMethod(Compilation& comp) :
        SimpleSystemSubroutine("putc", SubroutineKind::Function, 2,
                               {&comp.getIntType(), &comp.getByteType()}, comp.getVoidType(), true,
                               /* isFirstArgLValue */ true) {}